

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::Compaction::AddInputDeletions(Compaction *this,VersionEdit *edit)

{
  pointer ppFVar1;
  size_t i;
  ulong uVar2;
  int which;
  long lVar3;
  
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    for (uVar2 = 0;
        ppFVar1 = this->inputs_[lVar3].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar2 < (ulong)((long)this->inputs_[lVar3].
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
        uVar2 = uVar2 + 1) {
      VersionEdit::DeleteFile(edit,this->level_ + (int)lVar3,ppFVar1[uVar2]->number);
    }
  }
  return;
}

Assistant:

void Compaction::AddInputDeletions(VersionEdit* edit) {
  for (int which = 0; which < 2; which++) {
    for (size_t i = 0; i < inputs_[which].size(); i++) {
      edit->DeleteFile(level_ + which, inputs_[which][i]->number);
    }
  }
}